

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cc
# Opt level: O2

void __thiscall
iqxmlrpc::anon_unknown_0::Http_server_connection::log_exception
          (Http_server_connection *this,exception *ex)

{
  string s;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"iqxmlrpc::Http_server_connection: ",&local_39);
  (**(code **)(*(long *)ex + 0x10))(ex);
  std::__cxx11::string::append((char *)&local_38);
  Server::log_err_msg((this->super_Server_connection).server,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Http_server_connection::log_exception( const std::exception& ex )
{
  std::string s( "iqxmlrpc::Http_server_connection: " );
  s += ex.what();
  server->log_err_msg( s );
}